

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow(bool *p_open)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  ImGuiViewportP **ppIVar6;
  ImGuiPopupData *pIVar7;
  ImGuiSettingsHandler *pIVar8;
  ImGuiWindow **ppIVar9;
  ImGuiTable *pIVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  char *pcVar16;
  ImRect r_5;
  float thickness;
  ImU32 col;
  ImRect r_4;
  int column_n_1;
  ImDrawList *draw_list_1;
  ImGuiTable *table_1;
  int table_n_1;
  float font_size;
  char buf_1 [32];
  ImRect r_3;
  ImDrawList *draw_list;
  ImGuiWindow *window_1;
  int n_3;
  char *input_source_names [5];
  ImGuiTableSettings *settings_1;
  ImGuiWindowSettings *settings;
  int n_2;
  int n_1;
  int n;
  ImGuiWindow *window;
  int i_1;
  int i;
  int draw_list_i;
  int layer_i;
  ImGuiViewportP *viewport;
  int viewport_i_1;
  int viewport_i;
  int drawlist_count;
  ImRect r_2;
  ImRect r_1;
  int column_n;
  int rect_n_1;
  char buf [128];
  ImGuiTable *table;
  int table_n;
  ImRect r;
  int rect_n;
  char *trt_rects_names [13];
  char *wrt_rects_names [8];
  ImGuiMetricsConfig *cfg;
  ImGuiIO *io;
  ImGuiContext *g;
  ImVec2 *in_stack_fffffffffffffad8;
  float in_stack_fffffffffffffae0;
  float in_stack_fffffffffffffae4;
  float in_stack_fffffffffffffae8;
  ImU32 in_stack_fffffffffffffaec;
  undefined4 in_stack_fffffffffffffaf0;
  float in_stack_fffffffffffffaf4;
  ImVec2 *in_stack_fffffffffffffaf8;
  ImVec2 *this;
  size_t in_stack_fffffffffffffb00;
  ImDrawList *this_00;
  ImVec2 *in_stack_fffffffffffffb08;
  ImGuiWindow *in_stack_fffffffffffffb10;
  char *local_4e8;
  void *in_stack_fffffffffffffb20;
  char *local_4d8;
  ImGuiTableSettings *in_stack_fffffffffffffb30;
  char *local_4c8;
  char *local_4c0;
  char *in_stack_fffffffffffffb60;
  float in_stack_fffffffffffffb68;
  ImU32 in_stack_fffffffffffffb6c;
  ImDrawList *in_stack_fffffffffffffb70;
  undefined7 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7f;
  ImDrawList *in_stack_fffffffffffffb80;
  ImVec2 *in_stack_fffffffffffffba8;
  ImDrawList *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  bool *in_stack_fffffffffffffc20;
  char *in_stack_fffffffffffffc28;
  ImVec2 *in_stack_fffffffffffffc68;
  ImGuiTabBar *in_stack_fffffffffffffc70;
  int local_324;
  int local_310;
  ImVec2 local_30c;
  ImVec2 local_304;
  float local_2fc;
  char local_2f8 [40];
  ImRect local_2d0;
  ImDrawList *local_2c0;
  ImGuiWindow *local_2b8;
  int local_2ac;
  undefined8 local_2a8 [6];
  ImVec2 local_278;
  ImGuiTableSettings *local_270;
  ImGuiWindowSettings *local_268;
  int local_25c;
  int local_258;
  int local_254;
  ImGuiWindow *local_250;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  ImGuiViewportP *local_238;
  int local_22c;
  int local_228;
  uint local_224;
  ImVec2 local_220;
  ImVec2 local_218;
  ImVec2 in_stack_fffffffffffffdf0;
  ImVec2 in_stack_fffffffffffffdf8;
  ImVec2 in_stack_fffffffffffffe00;
  ImRect local_1f8;
  ImVec2 local_1e8;
  ImVec2 local_1e0;
  ImVec2 local_1d8;
  ImVec2 local_1d0;
  ImVec2 local_1c8;
  ImRect local_1c0;
  uint local_1b0;
  int local_1ac;
  char local_1a8 [144];
  ImVec2 local_118;
  float in_stack_fffffffffffffef4;
  bool *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  int local_f8;
  float local_f4;
  float fStack_e8;
  int local_e4;
  ImVec2 local_e0;
  undefined8 local_d8 [14];
  undefined8 local_68 [9];
  ImGuiMetricsConfig *local_20;
  ImGuiIO *local_18;
  ImGuiContext *local_10;
  
  bVar1 = Begin(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                (ImGuiWindowFlags)in_stack_fffffffffffffef4);
  if (bVar1) {
    local_10 = GImGui;
    local_18 = &GImGui->IO;
    local_20 = &GImGui->DebugMetricsConfig;
    pcVar5 = GetVersion();
    Text("Dear ImGui %s",pcVar5);
    Text((char *)(double)(1000.0 / local_18->Framerate),
         "Application average %.3f ms/frame (%.1f FPS)");
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)local_18->MetricsRenderVertices,
         (ulong)(uint)local_18->MetricsRenderIndices,
         (long)local_18->MetricsRenderIndices / 3 & 0xffffffff);
    Text("%d active windows (%d visible)",(ulong)(uint)local_18->MetricsActiveWindows,
         (ulong)(uint)local_18->MetricsRenderWindows);
    Text("%d active allocations",(ulong)(uint)local_18->MetricsActiveAllocations);
    Separator();
    memcpy(local_68,&PTR_anon_var_dwarf_2591a_00205b60,0x40);
    memcpy(local_d8,&PTR_anon_var_dwarf_2591a_00205ba0,0x68);
    if (local_20->ShowWindowsRectsType < 0) {
      local_20->ShowWindowsRectsType = 4;
    }
    if (local_20->ShowTablesRectsType < 0) {
      local_20->ShowTablesRectsType = 2;
    }
    bVar1 = TreeNode((char *)in_stack_fffffffffffffad8);
    if (bVar1) {
      ImVec2::ImVec2(&local_e0,0.0,0.0);
      bVar1 = Button((char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                     in_stack_fffffffffffffad8);
      if (bVar1) {
        DebugStartItemPicker();
      }
      SameLine(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0);
      MetricsHelpMarker((char *)0x16a48d);
      Checkbox(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      Checkbox(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      SameLine(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0);
      fVar12 = GetFontSize();
      SetNextItemWidth(fVar12 * 12.0);
      bVar1 = Combo((char *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                    (int *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                    (char **)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                    (int)((ulong)in_stack_fffffffffffffad8 >> 0x20),(int)in_stack_fffffffffffffad8);
      local_20->ShowWindowsRects = (local_20->ShowWindowsRects & 1U) != 0 || bVar1;
      if (((local_20->ShowWindowsRects & 1U) != 0) && (local_10->NavWindow != (ImGuiWindow *)0x0)) {
        BulletText("\'%s\':",local_10->NavWindow->Name);
        Indent(in_stack_fffffffffffffaf4);
        for (local_e4 = 0; local_e4 < 8; local_e4 = local_e4 + 1) {
          _local_f4 = ShowMetricsWindow::Funcs::GetWindowRect
                                (in_stack_fffffffffffffb10,
                                 (int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
          pcVar5 = (char *)(double)local_f4;
          dVar13 = (double)local_f4._4_4_;
          dVar14 = (double)local_f4._8_4_;
          dVar15 = (double)fStack_e8;
          fVar12 = ImRect::GetWidth((ImRect *)&local_f4);
          fVar11 = ImRect::GetHeight((ImRect *)&local_f4);
          Text(pcVar5,dVar13,dVar14,dVar15,(double)fVar12,(double)fVar11,
               "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",local_68[local_e4]);
        }
        Unindent(in_stack_fffffffffffffaf4);
      }
      Checkbox(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      Checkbox(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      Checkbox(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      SameLine(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0);
      fVar12 = GetFontSize();
      SetNextItemWidth(fVar12 * 12.0);
      bVar1 = Combo((char *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                    (int *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                    (char **)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                    (int)((ulong)in_stack_fffffffffffffad8 >> 0x20),(int)in_stack_fffffffffffffad8);
      local_20->ShowTablesRects = (local_20->ShowTablesRects & 1U) != 0 || bVar1;
      if (((local_20->ShowTablesRects & 1U) != 0) && (local_10->NavWindow != (ImGuiWindow *)0x0)) {
        for (local_f8 = 0; iVar2 = ImPool<ImGuiTable>::GetSize(&local_10->Tables), local_f8 < iVar2;
            local_f8 = local_f8 + 1) {
          pIVar10 = ImPool<ImGuiTable>::GetByIndex
                              ((ImPool<ImGuiTable> *)
                               CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                               (ImPoolIdx)((ulong)in_stack_fffffffffffffad8 >> 0x20));
          if ((local_10->FrameCount + -1 <= pIVar10->LastFrameActive) &&
             ((pIVar10->OuterWindow == local_10->NavWindow ||
              (pIVar10->InnerWindow == local_10->NavWindow)))) {
            BulletText("Table 0x%08X (%d columns, in \'%s\')",(ulong)pIVar10->ID,
                       (ulong)(uint)pIVar10->ColumnsCount,pIVar10->OuterWindow->Name);
            bVar1 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffae0);
            if (bVar1) {
              GetForegroundDrawList();
              ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffef0,1.0,1.0);
              operator-(in_stack_fffffffffffffad8,(ImVec2 *)0x16a8fd);
              in_stack_fffffffffffffc68 = &(pIVar10->OuterRect).Max;
              in_stack_fffffffffffffc70 = (ImGuiTabBar *)(local_1a8 + 0x88);
              ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffc70,1.0,1.0);
              local_118 = operator+(in_stack_fffffffffffffad8,(ImVec2 *)0x16a952);
              ImDrawList::AddRect(in_stack_fffffffffffffb80,
                                  (ImVec2 *)
                                  CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                                  (ImVec2 *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
                                  in_stack_fffffffffffffb68,
                                  (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffb60 >> 0x20),
                                  SUB84(in_stack_fffffffffffffb60,0));
            }
            Indent(in_stack_fffffffffffffaf4);
            for (local_1ac = 0; local_1ac < 0xd; local_1ac = local_1ac + 1) {
              if (local_1ac < 6) {
                local_1f8 = ShowMetricsWindow::Funcs::GetTableRect
                                      ((ImGuiTable *)in_stack_fffffffffffffb10,
                                       (int)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                                       (int)in_stack_fffffffffffffb08);
                in_stack_fffffffffffffbb8 = local_1a8;
                pcVar5 = (char *)(double)local_1f8.Min.x;
                dVar13 = (double)local_1f8.Min.y;
                pcVar16 = (char *)(double)local_1f8.Max.x;
                dVar14 = (double)local_1f8.Max.y;
                fVar12 = ImRect::GetWidth(&local_1f8);
                fVar11 = ImRect::GetHeight(&local_1f8);
                ImFormatString(pcVar5,(size_t)dVar13,pcVar16,dVar14,(double)fVar12,(double)fVar11,
                               in_stack_fffffffffffffbb8,0x80,
                               "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",
                               local_d8[local_1ac]);
                ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffe00,0.0,0.0);
                Selectable(in_stack_fffffffffffffbb8,
                           SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0),
                           (ImGuiSelectableFlags)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8
                          );
                bVar1 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffae0);
                if (bVar1) {
                  in_stack_fffffffffffffbb0 = GetForegroundDrawList();
                  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffdf0,1.0,1.0);
                  in_stack_fffffffffffffdf8 =
                       operator-(in_stack_fffffffffffffad8,(ImVec2 *)0x16ae0a);
                  in_stack_fffffffffffffba8 = &local_220;
                  ImVec2::ImVec2(in_stack_fffffffffffffba8,1.0,1.0);
                  local_218 = operator+(in_stack_fffffffffffffad8,(ImVec2 *)0x16ae59);
                  ImDrawList::AddRect(in_stack_fffffffffffffb80,
                                      (ImVec2 *)
                                      CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                                      (ImVec2 *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
                                      in_stack_fffffffffffffb68,
                                      (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffb60 >> 0x20),
                                      SUB84(in_stack_fffffffffffffb60,0));
                }
              }
              else if ((local_1ac == 6) || (local_1ac == 8)) {
                for (local_1b0 = 0; (int)local_1b0 < pIVar10->ColumnsCount;
                    local_1b0 = local_1b0 + 1) {
                  local_1c0 = ShowMetricsWindow::Funcs::GetTableRect
                                        ((ImGuiTable *)in_stack_fffffffffffffb10,
                                         (int)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                                         (int)in_stack_fffffffffffffb08);
                  pcVar5 = (char *)(double)local_1c0.Min.x;
                  dVar13 = (double)local_1c0.Min.y;
                  pcVar16 = (char *)(double)local_1c0.Max.x;
                  dVar14 = (double)local_1c0.Max.y;
                  fVar12 = ImRect::GetWidth(&local_1c0);
                  fVar11 = ImRect::GetHeight(&local_1c0);
                  ImFormatString(pcVar5,(size_t)dVar13,pcVar16,dVar14,(double)fVar12,(double)fVar11,
                                 local_1a8,0x80,
                                 "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s",
                                 (ulong)local_1b0,local_d8[local_1ac]);
                  ImVec2::ImVec2(&local_1c8,0.0,0.0);
                  Selectable(in_stack_fffffffffffffbb8,
                             SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0),
                             (ImGuiSelectableFlags)in_stack_fffffffffffffbb0,
                             in_stack_fffffffffffffba8);
                  bVar1 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffae0);
                  if (bVar1) {
                    GetForegroundDrawList();
                    ImVec2::ImVec2(&local_1d8,1.0,1.0);
                    local_1d0 = operator-(in_stack_fffffffffffffad8,(ImVec2 *)0x16abb2);
                    ImVec2::ImVec2(&local_1e8,1.0,1.0);
                    local_1e0 = operator+(in_stack_fffffffffffffad8,(ImVec2 *)0x16ac01);
                    ImDrawList::AddRect(in_stack_fffffffffffffb80,
                                        (ImVec2 *)
                                        CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78
                                                ),(ImVec2 *)in_stack_fffffffffffffb70,
                                        in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68,
                                        (ImDrawCornerFlags)
                                        ((ulong)in_stack_fffffffffffffb60 >> 0x20),
                                        SUB84(in_stack_fffffffffffffb60,0));
                  }
                }
              }
            }
            Unindent(in_stack_fffffffffffffaf4);
          }
        }
      }
      TreePop();
    }
    DebugNodeWindowsList
              ((ImVector<ImGuiWindow_*> *)
               CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               (char *)in_stack_fffffffffffffad8);
    local_224 = 0;
    for (local_228 = 0; local_228 < (local_10->Viewports).Size; local_228 = local_228 + 1) {
      ppIVar6 = ImVector<ImGuiViewportP_*>::operator[](&local_10->Viewports,local_228);
      iVar2 = ImDrawDataBuilder::GetDrawListCount(&(*ppIVar6)->DrawDataBuilder);
      local_224 = iVar2 + local_224;
    }
    bVar1 = TreeNode("DrawLists","DrawLists (%d)",(ulong)local_224);
    if (bVar1) {
      for (local_22c = 0; local_22c < (local_10->Viewports).Size; local_22c = local_22c + 1) {
        ppIVar6 = ImVector<ImGuiViewportP_*>::operator[](&local_10->Viewports,local_22c);
        local_238 = *ppIVar6;
        for (local_23c = 0; local_23c < 2; local_23c = local_23c + 1) {
          for (local_240 = 0; local_240 < (local_238->DrawDataBuilder).Layers[local_23c].Size;
              local_240 = local_240 + 1) {
            ImVector<ImDrawList_*>::operator[]
                      ((local_238->DrawDataBuilder).Layers + local_23c,local_240);
            DebugNodeDrawList((ImGuiWindow *)in_stack_fffffffffffffe00,
                              (ImDrawList *)in_stack_fffffffffffffdf8,
                              (char *)in_stack_fffffffffffffdf0);
          }
        }
      }
      TreePop();
    }
    bVar1 = TreeNode("Viewports","Viewports (%d)",(ulong)(uint)(local_10->Viewports).Size);
    if (bVar1) {
      GetTreeNodeToLabelSpacing();
      Indent(in_stack_fffffffffffffaf4);
      RenderViewportsThumbnails();
      GetTreeNodeToLabelSpacing();
      Unindent(in_stack_fffffffffffffaf4);
      for (local_244 = 0; local_244 < (local_10->Viewports).Size; local_244 = local_244 + 1) {
        ImVector<ImGuiViewportP_*>::operator[](&local_10->Viewports,local_244);
        DebugNodeViewport((ImGuiViewportP *)
                          CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      }
      TreePop();
    }
    bVar1 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(local_10->OpenPopupStack).Size);
    if (bVar1) {
      for (local_248 = 0; local_248 < (local_10->OpenPopupStack).Size; local_248 = local_248 + 1) {
        pIVar7 = ImVector<ImGuiPopupData>::operator[](&local_10->OpenPopupStack,local_248);
        local_250 = pIVar7->Window;
        pIVar7 = ImVector<ImGuiPopupData>::operator[](&local_10->OpenPopupStack,local_248);
        if (local_250 == (ImGuiWindow *)0x0) {
          in_stack_fffffffffffffb70 = (ImDrawList *)0x1e6265;
        }
        else {
          in_stack_fffffffffffffb70 = (ImDrawList *)local_250->Name;
        }
        in_stack_fffffffffffffb7f = false;
        if (local_250 != (ImGuiWindow *)0x0) {
          in_stack_fffffffffffffb7f = (local_250->Flags & 0x1000000U) != 0;
        }
        in_stack_fffffffffffffb60 = "";
        if ((bool)in_stack_fffffffffffffb7f != false) {
          in_stack_fffffffffffffb60 = " ChildWindow";
        }
        uVar3 = in_stack_fffffffffffffb6c & 0xffffff;
        if (local_250 != (ImGuiWindow *)0x0) {
          uVar3 = CONCAT13((local_250->Flags & 0x10000000U) != 0,(int3)in_stack_fffffffffffffb6c);
        }
        in_stack_fffffffffffffb6c = uVar3;
        pcVar5 = "";
        if ((char)(in_stack_fffffffffffffb6c >> 0x18) != '\0') {
          pcVar5 = " ChildMenu";
        }
        in_stack_fffffffffffffb80 = in_stack_fffffffffffffb70;
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)pIVar7->PopupId,
                   in_stack_fffffffffffffb70,in_stack_fffffffffffffb60,pcVar5);
      }
      TreePop();
    }
    uVar3 = ImPool<ImGuiTabBar>::GetSize(&local_10->TabBars);
    bVar1 = TreeNode("TabBars","Tab Bars (%d)",(ulong)uVar3);
    if (bVar1) {
      for (local_254 = 0; iVar2 = local_254,
          iVar4 = ImPool<ImGuiTabBar>::GetSize(&local_10->TabBars), iVar2 < iVar4;
          local_254 = local_254 + 1) {
        ImPool<ImGuiTabBar>::GetByIndex
                  ((ImPool<ImGuiTabBar> *)
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                   (ImPoolIdx)((ulong)in_stack_fffffffffffffad8 >> 0x20));
        DebugNodeTabBar(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
      }
      TreePop();
    }
    uVar3 = ImPool<ImGuiTable>::GetSize(&local_10->Tables);
    bVar1 = TreeNode("Tables","Tables (%d)",(ulong)uVar3);
    if (bVar1) {
      for (local_258 = 0; iVar2 = local_258, iVar4 = ImPool<ImGuiTable>::GetSize(&local_10->Tables),
          iVar2 < iVar4; local_258 = local_258 + 1) {
        ImPool<ImGuiTable>::GetByIndex
                  ((ImPool<ImGuiTable> *)
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                   (ImPoolIdx)((ulong)in_stack_fffffffffffffad8 >> 0x20));
        DebugNodeTable(local_f4._4_8_);
      }
      TreePop();
    }
    bVar1 = TreeNode((char *)in_stack_fffffffffffffad8);
    if (bVar1) {
      bVar1 = SmallButton((char *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
      if (bVar1) {
        ClearIniSettings();
      }
      SameLine(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0);
      bVar1 = SmallButton((char *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
      if (bVar1) {
        SaveIniSettingsToMemory
                  ((size_t *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
      }
      SameLine(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0);
      bVar1 = SmallButton((char *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
      if (bVar1) {
        SaveIniSettingsToDisk((char *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0))
        ;
      }
      SameLine(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0);
      if ((local_10->IO).IniFilename == (char *)0x0) {
        TextUnformatted((char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                        (char *)in_stack_fffffffffffffad8);
      }
      else {
        Text("\"%s\"",(local_10->IO).IniFilename);
      }
      Text((char *)(double)local_10->SettingsDirtyTimer,"SettingsDirtyTimer %.2f");
      bVar1 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                       (ulong)(uint)(local_10->SettingsHandlers).Size);
      if (bVar1) {
        for (local_25c = 0; local_25c < (local_10->SettingsHandlers).Size; local_25c = local_25c + 1
            ) {
          pIVar8 = ImVector<ImGuiSettingsHandler>::operator[](&local_10->SettingsHandlers,local_25c)
          ;
          BulletText("%s",pIVar8->TypeName);
        }
        TreePop();
      }
      uVar3 = ImChunkStream<ImGuiWindowSettings>::size(&local_10->SettingsWindows);
      bVar1 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",(ulong)uVar3);
      if (bVar1) {
        local_268 = ImChunkStream<ImGuiWindowSettings>::begin(&local_10->SettingsWindows);
        while (local_268 != (ImGuiWindowSettings *)0x0) {
          DebugNodeWindowSettings
                    ((ImGuiWindowSettings *)
                     CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
          local_268 = ImChunkStream<ImGuiWindowSettings>::next_chunk
                                ((ImChunkStream<ImGuiWindowSettings> *)in_stack_fffffffffffffaf8,
                                 (ImGuiWindowSettings *)
                                 CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
        }
        TreePop();
      }
      uVar3 = ImChunkStream<ImGuiTableSettings>::size(&local_10->SettingsTables);
      bVar1 = TreeNode("SettingsTables","Settings packed data: Tables: %d bytes",(ulong)uVar3);
      if (bVar1) {
        local_270 = ImChunkStream<ImGuiTableSettings>::begin(&local_10->SettingsTables);
        while (local_270 != (ImGuiTableSettings *)0x0) {
          DebugNodeTableSettings(in_stack_fffffffffffffb30);
          local_270 = ImChunkStream<ImGuiTableSettings>::next_chunk
                                ((ImChunkStream<ImGuiTableSettings> *)in_stack_fffffffffffffaf8,
                                 (ImGuiTableSettings *)
                                 CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
        }
        TreePop();
      }
      uVar3 = ImGuiTextBuffer::size(&local_10->SettingsIniData);
      bVar1 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",(ulong)uVar3);
      if (bVar1) {
        ImGuiTextBuffer::c_str(&local_10->SettingsIniData);
        fVar12 = GetTextLineHeight();
        ImVec2::ImVec2(&local_278,-1.1754944e-38,fVar12 * 20.0);
        in_stack_fffffffffffffad8 = (ImVec2 *)0x0;
        InputTextMultiline((char *)in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
                           in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                           (ImGuiInputTextFlags)in_stack_fffffffffffffaf4,
                           (ImGuiInputTextCallback)
                           CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                           in_stack_fffffffffffffb20);
        TreePop();
      }
      TreePop();
    }
    bVar1 = TreeNode((char *)in_stack_fffffffffffffad8);
    if (bVar1) {
      memcpy(local_2a8,&PTR_anon_var_dwarf_25caf_00205c10,0x28);
      Text("WINDOWING");
      Indent(in_stack_fffffffffffffaf4);
      if (local_10->HoveredWindow == (ImGuiWindow *)0x0) {
        local_4c0 = "NULL";
      }
      else {
        local_4c0 = local_10->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",local_4c0);
      if (local_10->HoveredRootWindow == (ImGuiWindow *)0x0) {
        local_4c8 = "NULL";
      }
      else {
        local_4c8 = local_10->HoveredRootWindow->Name;
      }
      Text("HoveredRootWindow: \'%s\'",local_4c8);
      if (local_10->HoveredWindowUnderMovingWindow == (ImGuiWindow *)0x0) {
        pcVar5 = "NULL";
      }
      else {
        pcVar5 = local_10->HoveredWindowUnderMovingWindow->Name;
      }
      Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar5);
      if (local_10->MovingWindow == (ImGuiWindow *)0x0) {
        local_4d8 = "NULL";
      }
      else {
        local_4d8 = local_10->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",local_4d8);
      Unindent(in_stack_fffffffffffffaf4);
      Text("ITEMS");
      Indent(in_stack_fffffffffffffaf4);
      Text((char *)(double)local_10->ActiveIdTimer,
           "ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           (ulong)local_10->ActiveId,(ulong)local_10->ActiveIdPreviousFrame,
           (ulong)(local_10->ActiveIdAllowOverlap & 1),local_2a8[local_10->ActiveIdSource]);
      if (local_10->ActiveIdWindow == (ImGuiWindow *)0x0) {
        pcVar5 = "NULL";
      }
      else {
        pcVar5 = local_10->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar5);
      Text((char *)(double)local_10->HoveredIdTimer,
           "HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",(ulong)local_10->HoveredId,
           (ulong)local_10->HoveredIdPreviousFrame,(ulong)(local_10->HoveredIdAllowOverlap & 1));
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)(local_10->DragDropActive & 1),(ulong)(local_10->DragDropPayload).SourceId,
           (local_10->DragDropPayload).DataType,(ulong)(uint)(local_10->DragDropPayload).DataSize);
      Unindent(in_stack_fffffffffffffaf4);
      Text("NAV,FOCUS");
      Indent(in_stack_fffffffffffffaf4);
      if (local_10->NavWindow == (ImGuiWindow *)0x0) {
        local_4e8 = "NULL";
      }
      else {
        local_4e8 = local_10->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",local_4e8);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)local_10->NavId,(ulong)local_10->NavLayer);
      Text("NavInputSource: %s",local_2a8[local_10->NavInputSource]);
      Text("NavActive: %d, NavVisible: %d",(ulong)((local_10->IO).NavActive & 1),
           (ulong)((local_10->IO).NavVisible & 1));
      Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)local_10->NavActivateId,
           (ulong)local_10->NavInputId);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",
           (ulong)(local_10->NavDisableHighlight & 1),(ulong)(local_10->NavDisableMouseHover & 1));
      Text("NavFocusScopeId = 0x%08X",(ulong)local_10->NavFocusScopeId);
      if (local_10->NavWindowingTarget == (ImGuiWindow *)0x0) {
        in_stack_fffffffffffffb10 = (ImGuiWindow *)0x1e6265;
      }
      else {
        in_stack_fffffffffffffb10 = (ImGuiWindow *)local_10->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",in_stack_fffffffffffffb10);
      Unindent(in_stack_fffffffffffffaf4);
      TreePop();
    }
    if (((local_20->ShowWindowsRects & 1U) != 0) || ((local_20->ShowWindowsBeginOrder & 1U) != 0)) {
      for (local_2ac = 0; local_2ac < (local_10->Windows).Size; local_2ac = local_2ac + 1) {
        ppIVar9 = ImVector<ImGuiWindow_*>::operator[](&local_10->Windows,local_2ac);
        local_2b8 = *ppIVar9;
        if ((local_2b8->WasActive & 1U) != 0) {
          local_2c0 = GetForegroundDrawList((ImGuiWindow *)0x16bcf4);
          if ((local_20->ShowWindowsRects & 1U) != 0) {
            local_2d0 = ShowMetricsWindow::Funcs::GetWindowRect
                                  (in_stack_fffffffffffffb10,
                                   (int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
            ImDrawList::AddRect(in_stack_fffffffffffffb80,
                                (ImVec2 *)
                                CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                                (ImVec2 *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
                                in_stack_fffffffffffffb68,
                                (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffb60 >> 0x20),
                                SUB84(in_stack_fffffffffffffb60,0));
          }
          if (((local_20->ShowWindowsBeginOrder & 1U) != 0) &&
             ((local_2b8->Flags & 0x1000000U) == 0)) {
            ImFormatString(local_2f8,0x20,"%d",(ulong)(uint)(int)local_2b8->BeginOrderWithinContext)
            ;
            local_2fc = GetFontSize();
            in_stack_fffffffffffffb08 = &local_2b8->Pos;
            this = &local_30c;
            this_00 = local_2c0;
            ImVec2::ImVec2(this,local_2fc,local_2fc);
            local_304 = operator+(in_stack_fffffffffffffad8,(ImVec2 *)0x16be18);
            ImDrawList::AddRectFilled
                      (this_00,this,
                       (ImVec2 *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                       in_stack_fffffffffffffaec,in_stack_fffffffffffffae8,
                       (ImDrawCornerFlags)in_stack_fffffffffffffae4);
            ImDrawList::AddText(this_00,this,(ImU32)in_stack_fffffffffffffaf4,
                                (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8
                                                ),
                                (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0
                                                ));
          }
        }
      }
    }
    if ((local_20->ShowTablesRects & 1U) != 0) {
      local_310 = 0;
      while (iVar2 = local_310, iVar4 = ImPool<ImGuiTable>::GetSize(&local_10->Tables),
            iVar2 < iVar4) {
        pIVar10 = ImPool<ImGuiTable>::GetByIndex
                            ((ImPool<ImGuiTable> *)
                             CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                             (ImPoolIdx)((ulong)in_stack_fffffffffffffad8 >> 0x20));
        if (local_10->FrameCount + -1 <= pIVar10->LastFrameActive) {
          GetForegroundDrawList((ImGuiWindow *)0x16bf31);
          if (local_20->ShowTablesRectsType < 6) {
            ShowMetricsWindow::Funcs::GetTableRect
                      ((ImGuiTable *)in_stack_fffffffffffffb10,
                       (int)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                       (int)in_stack_fffffffffffffb08);
            ImDrawList::AddRect(in_stack_fffffffffffffb80,
                                (ImVec2 *)
                                CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                                (ImVec2 *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
                                in_stack_fffffffffffffb68,
                                (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffb60 >> 0x20),
                                SUB84(in_stack_fffffffffffffb60,0));
          }
          else {
            for (local_324 = 0; local_324 < pIVar10->ColumnsCount; local_324 = local_324 + 1) {
              ShowMetricsWindow::Funcs::GetTableRect
                        ((ImGuiTable *)in_stack_fffffffffffffb10,
                         (int)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                         (int)in_stack_fffffffffffffb08);
              ImDrawList::AddRect(in_stack_fffffffffffffb80,
                                  (ImVec2 *)
                                  CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                                  (ImVec2 *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
                                  in_stack_fffffffffffffb68,
                                  (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffb60 >> 0x20),
                                  SUB84(in_stack_fffffffffffffb60,0));
            }
          }
        }
        local_310 = local_310 + 1;
      }
    }
    End();
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!Begin("Dear ImGui Metrics/Debugger", p_open))
    {
        End();
        return;
    }

    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;

    // Basic info
    Text("Dear ImGui %s", GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    Text("%d active allocations", io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentIdeal, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentIdeal", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_InnerRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsWorkRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentFrozen, TRT_ColumnsContentUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "InnerRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsWorkRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentFrozen", "ColumnsContentUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }

        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Button("Item Picker.."))
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);

        Checkbox("Show tables rectangles", &cfg->ShowTablesRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowTablesRects |= Combo("##show_table_rects_type", &cfg->ShowTablesRectsType, trt_rects_names, TRT_Count, TRT_Count);
        if (cfg->ShowTablesRects && g.NavWindow != NULL)
        {
            for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
            {
                ImGuiTable* table = g.Tables.GetByIndex(table_n);
                if (table->LastFrameActive < g.FrameCount - 1 || (table->OuterWindow != g.NavWindow && table->InnerWindow != g.NavWindow))
                    continue;

                BulletText("Table 0x%08X (%d columns, in '%s')", table->ID, table->ColumnsCount, table->OuterWindow->Name);
                if (IsItemHovered())
                    GetForegroundDrawList()->AddRect(table->OuterRect.Min - ImVec2(1, 1), table->OuterRect.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                Indent();
                char buf[128];
                for (int rect_n = 0; rect_n < TRT_Count; rect_n++)
                {
                    if (rect_n >= TRT_ColumnsRect)
                    {
                        if (rect_n != TRT_ColumnsRect && rect_n != TRT_ColumnsClipRect)
                            continue;
                        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                        {
                            ImRect r = Funcs::GetTableRect(table, rect_n, column_n);
                            ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), column_n, trt_rects_names[rect_n]);
                            Selectable(buf);
                            if (IsItemHovered())
                                GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                        }
                    }
                    else
                    {
                        ImRect r = Funcs::GetTableRect(table, rect_n, -1);
                        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), trt_rects_names[rect_n]);
                        Selectable(buf);
                        if (IsItemHovered())
                            GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                    }
                }
                Unindent();
            }
        }

        TreePop();
    }

    // Windows
    DebugNodeWindowsList(&g.Windows, "Windows");
    //DebugNodeWindowsList(&g.WindowsFocusOrder, "WindowsFocusOrder");

    // DrawLists
    int drawlist_count = 0;
    for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        drawlist_count += g.Viewports[viewport_i]->DrawDataBuilder.GetDrawListCount();
    if (TreeNode("DrawLists", "DrawLists (%d)", drawlist_count))
    {
        for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        {
            ImGuiViewportP* viewport = g.Viewports[viewport_i];
            for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                    DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        }
        TreePop();
    }

    // Viewports
    if (TreeNode("Viewports", "Viewports (%d)", g.Viewports.Size))
    {
        Indent(GetTreeNodeToLabelSpacing());
        RenderViewportsThumbnails();
        Unindent(GetTreeNodeToLabelSpacing());
        for (int i = 0; i < g.Viewports.Size; i++)
            DebugNodeViewport(g.Viewports[i]);
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetSize()))
    {
        for (int n = 0; n < g.TabBars.GetSize(); n++)
            DebugNodeTabBar(g.TabBars.GetByIndex(n), "TabBar");
        TreePop();
    }

    // Details for Tables
#ifdef IMGUI_HAS_TABLE
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetSize()))
    {
        for (int n = 0; n < g.Tables.GetSize(); n++)
            DebugNodeTable(g.Tables.GetByIndex(n));
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_TABLE

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_TABLE
        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);

        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

#ifdef IMGUI_HAS_TABLE
    // Overlay: Display Tables Rectangles
    if (cfg->ShowTablesRects)
    {
        for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.GetByIndex(table_n);
            if (table->LastFrameActive < g.FrameCount - 1)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(table->OuterWindow);
            if (cfg->ShowTablesRectsType >= TRT_ColumnsRect)
            {
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                {
                    ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, column_n);
                    ImU32 col = (table->HoveredColumnBody == column_n) ? IM_COL32(255, 255, 128, 255) : IM_COL32(255, 0, 128, 255);
                    float thickness = (table->HoveredColumnBody == column_n) ? 3.0f : 1.0f;
                    draw_list->AddRect(r.Min, r.Max, col, 0.0f, ~0, thickness);
                }
            }
            else
            {
                ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, -1);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
        }
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}